

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# newtonmin.c
# Opt level: O0

void trstep(double *jac,double *sN,int N,double *dx,double *L,double *hess,double nlen,double *ioval
           ,double eps,double *step)

{
  double dVar1;
  bool bVar2;
  double *vec;
  double *vec_00;
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double *temp2;
  double *temp1;
  double phidinit;
  double phid;
  double phi;
  double deltaprev;
  double lambda;
  double delta;
  double lambdahi;
  double lambdalo;
  double lo;
  double hi;
  double steplen;
  double maxadd;
  double l2;
  double l1;
  double tvec;
  double sum;
  int j;
  int iter;
  int c1;
  int i;
  double eps_local;
  double nlen_local;
  double *hess_local;
  double *L_local;
  double *dx_local;
  int N_local;
  double *sN_local;
  double *jac_local;
  
  lambda = *ioval;
  deltaprev = ioval[1];
  dVar1 = ioval[2];
  phid = ioval[3];
  phidinit = ioval[4];
  temp1 = (double *)ioval[5];
  vec = (double *)malloc((long)N << 3);
  vec_00 = (double *)malloc((long)N << 3);
  if (lambda * 1.5 < nlen) {
    ioval[6] = 0.0;
    if (0.0 < deltaprev) {
      deltaprev = deltaprev - ((phid + dVar1) * ((dVar1 - lambda) + phid)) / (lambda * phidinit);
    }
    phid = nlen - lambda;
    if ((ioval[7] == 1.0) && (!NAN(ioval[7]))) {
      ioval[7] = 0.0;
      for (iter = 0; iter < N; iter = iter + 1) {
        vec[iter] = dx[iter] * dx[iter] * sN[iter];
      }
      *vec_00 = *vec / *L;
      for (iter = 1; iter < N; iter = iter + 1) {
        tvec = 0.0;
        for (sum._0_4_ = 0; sum._0_4_ < iter; sum._0_4_ = sum._0_4_ + 1) {
          tvec = vec_00[sum._0_4_] * L[iter * N + sum._0_4_] + tvec;
        }
        vec_00[iter] = (vec[iter] - tvec) / L[iter * N + iter];
      }
      dVar4 = l2norm(vec_00,N);
      temp1 = (double *)((-dVar4 * dVar4) / nlen);
    }
    lambdahi = -phid / (double)temp1;
    for (iter = 0; iter < N; iter = iter + 1) {
      vec[iter] = jac[iter] / dx[iter];
    }
    dVar4 = l2norm(vec,N);
    dVar4 = dVar4 / lambda;
    bVar2 = false;
    while (!bVar2) {
      if ((deltaprev < lambdahi) || (dVar4 < deltaprev)) {
        dVar5 = sqrt(lambdahi * dVar4);
        deltaprev = dVar4 * 0.001;
        if (deltaprev < dVar5) {
          deltaprev = dVar5;
        }
      }
      for (iter = 0; iter < N; iter = iter + 1) {
        iVar3 = iter * N + iter;
        hess[iVar3] = deltaprev * dx[iter] * dx[iter] + hess[iVar3];
      }
      cholmod(hess,N,L,eps,0.0);
      scale(jac,1,N,-1.0);
      linsolve_lower(L,N,jac,step);
      scale(jac,1,N,-1.0);
      for (iter = 0; iter < N; iter = iter + 1) {
        iVar3 = iter * N + iter;
        hess[iVar3] = -(deltaprev * dx[iter]) * dx[iter] + hess[iVar3];
      }
      for (iter = 0; iter < N; iter = iter + 1) {
        vec[iter] = step[iter] * dx[iter];
      }
      dVar5 = l2norm(vec,N);
      phid = dVar5 - lambda;
      for (iter = 0; iter < N; iter = iter + 1) {
        vec[iter] = dx[iter] * vec[iter];
      }
      *vec_00 = *vec / *L;
      for (iter = 1; iter < N; iter = iter + 1) {
        tvec = 0.0;
        for (sum._0_4_ = 0; sum._0_4_ < iter; sum._0_4_ = sum._0_4_ + 1) {
          tvec = vec_00[sum._0_4_] * L[iter * N + sum._0_4_] + tvec;
        }
        vec_00[iter] = (vec[iter] - tvec) / L[iter * N + iter];
      }
      dVar6 = l2norm(vec_00,N);
      phidinit = (-dVar6 * dVar6) / dVar5;
      if (((lambda * 0.75 <= dVar5) && (dVar5 <= lambda * 1.5)) || (0.0 <= dVar4 - lambdahi)) {
        bVar2 = true;
      }
      else {
        if (lambdahi <= deltaprev - phid / phidinit) {
          lambdahi = deltaprev - phid / phidinit;
        }
        if (phid < 0.0) {
          lambdahi = deltaprev;
        }
        deltaprev = deltaprev - (dVar5 * phid) / (lambda * phidinit);
      }
    }
  }
  else {
    ioval[6] = 1.0;
    for (iter = 0; iter < N; iter = iter + 1) {
      step[iter] = sN[iter];
    }
    deltaprev = 0.0;
    if (nlen < lambda) {
      lambda = nlen;
    }
  }
  *ioval = lambda;
  ioval[1] = deltaprev;
  ioval[2] = dVar1;
  ioval[3] = phid;
  ioval[4] = phidinit;
  ioval[5] = (double)temp1;
  free(vec);
  free(vec_00);
  return;
}

Assistant:

void trstep(double *jac,double *sN,int N,double * dx,double *L,double *hess,double nlen,double *ioval,double eps,
		double *step) {
	int i,c1,iter,j;
	double sum,tvec,l1,l2,maxadd,steplen;
	double hi,lo,lambdalo,lambdahi;
	double delta,lambda,deltaprev,phi,phid,phidinit;
	double *temp1,*temp2;
	
	hi = 1.5;lo = 0.75;
	delta = ioval[0];lambda = ioval[1]; deltaprev = ioval[2];
	phi = ioval[3]; phid = ioval[4] ; phidinit = ioval[5];
	temp1 = (double*) malloc(sizeof(double) *N);
	temp2 = (double*) malloc(sizeof(double) *N);
	
	if (nlen <= hi*delta) {
		ioval[6] = 1.0;
		for(i=0;i <N;++i) {
			step[i] = sN[i];
		}
		lambda = 0.;
		if (delta > nlen) {
			delta = nlen;
		}
		
	} else {
			ioval[6] = 0.0;
			if (lambda > 0.) {
				lambda -= (phi+deltaprev) * ((deltaprev - delta) + phi) /(delta * phid);
			}
			phi = nlen - delta;
			if (ioval[7] == 1.0) {
				ioval[7] = 0.0;
				for(i=0;i < N;++i) {
					temp1[i] = dx[i] * dx[i] * sN[i];
				}
				temp2[0] = temp1[0]/L[0];
				for(i = 1; i < N; ++i) {
					sum = 0.;
					c1 = i*N;
					for(j = 0; j < i; ++j) {
						sum += temp2[j] * L[c1 + j];
					}
					temp2[i] = (temp1[i] - sum)/L[c1+i];
				}
				tvec = l2norm(temp2,N);
				phidinit = - tvec*tvec/nlen;
			}
			lambdalo = - phi/phidinit;
			for(i=0;i < N;++i) {
				temp1[i] = jac[i]/dx[i];
			}
			tvec = l2norm(temp1,N);
			lambdahi = tvec / delta;
			iter = 0;
			while (iter == 0) {
				if (lambda < lambdalo || lambda > lambdahi) {
					l1 = sqrt(lambdalo * lambdahi);
					l2 = 0.001 *lambdahi;
					if (l1 > l2) {
						lambda = l1;
					} else {
						lambda = l2;
					}
				}
				
				for(i = 0; i < N;++i) {
					c1 = i*N;
					hess[c1+i] += lambda * dx[i] * dx[i];
				}
				maxadd = cholmod(hess,N,L,eps,0.0);
				scale(jac,1,N,-1.0);
				linsolve_lower(L,N,jac,step);
				scale(jac,1,N,-1.0);
				for(i = 0; i < N;++i) {
					c1 = i*N;
					hess[c1+i] -= lambda * dx[i] * dx[i];
				}
				for(i=0;i < N;++i) {
					temp1[i] = step[i] * dx[i];
				}
				steplen = l2norm(temp1,N);
				phi = steplen - delta;
				for(i=0;i < N;++i) {
					temp1[i] *= dx[i];
				}
				temp2[0] = temp1[0]/L[0];
				for(i = 1; i < N; ++i) {
					sum = 0.;
					c1 = i*N;
					for(j = 0; j < i; ++j) {
						sum += temp2[j] * L[c1 + j];
					}
					temp2[i] = (temp1[i] - sum)/L[c1+i];
				}
				tvec = l2norm(temp2,N);
				phid = - tvec*tvec/steplen;
				
				if ( (steplen >= lo * delta && steplen <= hi * delta ) || (lambdahi - lambdalo >= 0))  {
					iter = 1;
				} else {
					if (lambdalo <= lambda - (phi/phid)) {
						lambdalo = lambda - (phi/phid);
					}
					if (phi < 0) {
						lambdalo = lambda;
					}
					
					lambda -= (steplen *phi)/(delta*phid);
				}
				
			}
			
	}
	
	ioval[0] = delta;ioval[1] =lambda; ioval[2] = deltaprev;
	ioval[3] = phi; ioval[4] = phid ;ioval[5] = phidinit;
	
	free(temp1);
	free(temp2);
}